

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * MatrixNormalize(Matrix mat)

{
  Matrix mat_00;
  Matrix *in_RDI;
  float fVar1;
  float *pfVar2;
  Matrix *result;
  float det;
  
  pfVar2 = (float *)&stack0x00000008;
  memset(in_RDI,0,0x40);
  mat_00._56_8_ = pfVar2;
  mat_00._0_56_ = *(undefined1 (*) [56])(pfVar2 + 2);
  fVar1 = MatrixDeterminant(mat_00);
  in_RDI->m0 = *pfVar2 / fVar1;
  in_RDI->m1 = pfVar2[4] / fVar1;
  in_RDI->m2 = pfVar2[8] / fVar1;
  in_RDI->m3 = pfVar2[0xc] / fVar1;
  in_RDI->m4 = pfVar2[1] / fVar1;
  in_RDI->m5 = pfVar2[5] / fVar1;
  in_RDI->m6 = pfVar2[9] / fVar1;
  in_RDI->m7 = pfVar2[0xd] / fVar1;
  in_RDI->m8 = pfVar2[2] / fVar1;
  in_RDI->m9 = pfVar2[6] / fVar1;
  in_RDI->m10 = pfVar2[10] / fVar1;
  in_RDI->m11 = pfVar2[0xe] / fVar1;
  in_RDI->m12 = pfVar2[3] / fVar1;
  in_RDI->m13 = pfVar2[7] / fVar1;
  in_RDI->m14 = pfVar2[0xb] / fVar1;
  in_RDI->m15 = pfVar2[0xf] / fVar1;
  return in_RDI;
}

Assistant:

RMDEF Matrix MatrixNormalize(Matrix mat)
{
    Matrix result = { 0 };

    float det = MatrixDeterminant(mat);

    result.m0 = mat.m0/det;
    result.m1 = mat.m1/det;
    result.m2 = mat.m2/det;
    result.m3 = mat.m3/det;
    result.m4 = mat.m4/det;
    result.m5 = mat.m5/det;
    result.m6 = mat.m6/det;
    result.m7 = mat.m7/det;
    result.m8 = mat.m8/det;
    result.m9 = mat.m9/det;
    result.m10 = mat.m10/det;
    result.m11 = mat.m11/det;
    result.m12 = mat.m12/det;
    result.m13 = mat.m13/det;
    result.m14 = mat.m14/det;
    result.m15 = mat.m15/det;

    return result;
}